

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O2

Vec_Int_t * Gia_ManStgReadLines(char *pFileName,int *pnIns,int *pnOuts,int *pnStates)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  FILE *__stream;
  Vec_Int_t *p;
  char *pcVar4;
  ulong uVar5;
  int local_430;
  int local_42c;
  char pBuffer [1000];
  
  sVar3 = strlen(pFileName);
  iVar1 = strcmp(pFileName + (sVar3 - 3),"aig");
  if (iVar1 == 0) {
    p = (Vec_Int_t *)0x0;
    printf("Input file \"%s\" has extension \"%s\".\n",pFileName,"aig");
  }
  else {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      p = (Vec_Int_t *)0x0;
      printf("Cannot open file \"%s\".\n",pFileName);
    }
    else {
      p = Vec_IntAlloc(1000);
      local_430 = 1;
      uVar5 = 0xffffffffffffffff;
      local_42c = -1;
      while( true ) {
        pcVar4 = fgets(pBuffer,1000,__stream);
        iVar1 = (int)uVar5;
        if (pcVar4 == (char *)0x0) break;
        if ((pBuffer[0] != '#') && (pBuffer[0] != '.')) {
          pcVar4 = strtok(pBuffer," \r\n");
          sVar3 = strlen(pcVar4);
          if (iVar1 == -1) {
            uVar5 = sVar3 & 0xffffffff;
          }
          else if (iVar1 != (int)sVar3) {
            __assert_fail("nInputs == (int)strlen(pToken)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                          ,0x1d4,"Vec_Int_t *Gia_ManStgReadLines(char *, int *, int *, int *)");
          }
          uVar2 = Extra_ReadBinary(pcVar4);
          Vec_IntPush(p,uVar2);
          pcVar4 = strtok((char *)0x0," \r\n");
          iVar1 = atoi(pcVar4);
          Vec_IntPush(p,iVar1);
          iVar1 = Vec_IntEntryLast(p);
          if (local_430 <= iVar1 + 1) {
            local_430 = iVar1 + 1;
          }
          pcVar4 = strtok((char *)0x0," \r\n");
          iVar1 = atoi(pcVar4);
          Vec_IntPush(p,iVar1);
          pcVar4 = strtok((char *)0x0," \r\n");
          sVar3 = strlen(pcVar4);
          iVar1 = (int)sVar3;
          if ((local_42c != -1) && (iVar1 = local_42c, local_42c != (int)sVar3)) {
            __assert_fail("nOutputs == (int)strlen(pToken)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                          ,0x1e3,"Vec_Int_t *Gia_ManStgReadLines(char *, int *, int *, int *)");
          }
          local_42c = iVar1;
          uVar2 = Extra_ReadBinary(pcVar4);
          Vec_IntPush(p,uVar2);
        }
      }
      fclose(__stream);
      if (pnIns != (int *)0x0) {
        *pnIns = iVar1;
      }
      if (pnOuts != (int *)0x0) {
        *pnOuts = local_42c;
      }
      if (pnStates != (int *)0x0) {
        *pnStates = local_430;
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_ManStgReadLines( char * pFileName, int * pnIns, int * pnOuts, int * pnStates )
{
    Vec_Int_t * vLines;
    char pBuffer[1000];
    char * pToken;
    int Number, nInputs = -1, nOutputs = -1, nStates = 1;
    FILE * pFile;
    if ( !strcmp(pFileName + strlen(pFileName) - 3, "aig") )
    {
        printf( "Input file \"%s\" has extension \"%s\".\n", pFileName, "aig" );
        return NULL;
    }
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    vLines = Vec_IntAlloc( 1000 );
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        if ( pBuffer[0] == '.' || pBuffer[0] == '#' )
            continue;
        // read condition
        pToken = strtok( pBuffer, " \r\n" );
        if ( nInputs == -1 )
            nInputs = strlen(pToken);
        else
            assert( nInputs == (int)strlen(pToken) );
        Number = Extra_ReadBinary( pToken );
        Vec_IntPush( vLines, Number );
        // read current state
        pToken = strtok( NULL, " \r\n" );
        Vec_IntPush( vLines, atoi(pToken) );
        nStates = Abc_MaxInt( nStates, Vec_IntEntryLast(vLines)+1 );
        // read next state
        pToken = strtok( NULL, " \r\n" );
        Vec_IntPush( vLines, atoi(pToken) );
        // read output
        pToken = strtok( NULL, " \r\n" );
        if ( nOutputs == -1 )
            nOutputs = strlen(pToken);
        else
            assert( nOutputs == (int)strlen(pToken) );
        Number = Extra_ReadBinary( pToken );
        Vec_IntPush( vLines, Number );
    }
    fclose( pFile );
    if ( pnIns )
        *pnIns = nInputs;
    if ( pnOuts )
        *pnOuts = nOutputs;
    if ( pnStates )
        *pnStates = nStates;
    return vLines;
}